

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O2

void AddCubesToStartingCover(Vec_Wec_t *vEsop)

{
  drow *pdVar1;
  byte bVar2;
  uint uVar3;
  int Lit;
  int iVar4;
  uint uVar5;
  int *pVars;
  int *pVarValues;
  ulong uVar6;
  Cube *pC;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  Vec_Int_t *vCube;
  
  iVar10 = g_CoverInfo.nVarsIn;
  lVar9 = (long)g_CoverInfo.nVarsIn;
  pVars = (int *)malloc(lVar9 << 2);
  pVarValues = (int *)malloc(lVar9 << 2);
  uVar6 = 0;
  uVar7 = 0;
  if (0 < iVar10) {
    uVar7 = (ulong)(uint)iVar10;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pVars[uVar6] = (int)uVar6;
  }
  g_CoverInfo.nLiteralsBefore = 0;
  g_CoverInfo.QCostBefore = 0;
  lVar9 = 0;
  while( true ) {
    if (vEsop->nSize <= lVar9) {
      free(pVars);
      free(pVarValues);
      if (g_CoverInfo.nCubesFree + g_CoverInfo.nCubesInUse != g_CoverInfo.nCubesAlloc) {
        __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exor.c"
                      ,0x2fd,"void AddCubesToStartingCover(Vec_Wec_t *)");
      }
      return;
    }
    iVar10 = vEsop->pArray[lVar9].nSize;
    if (iVar10 < 1) break;
    vCube = vEsop->pArray + lVar9;
    uVar3 = iVar10 - 1;
    vCube->nSize = uVar3;
    uVar3 = vCube->pArray[uVar3];
    uVar6 = (ulong)(uint)g_CoverInfo.nVarsIn;
    if (g_CoverInfo.nVarsIn < 1) {
      uVar6 = 0;
    }
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pVarValues[uVar7] = 3;
    }
    for (iVar10 = 0; iVar10 < vCube->nSize; iVar10 = iVar10 + 1) {
      Lit = Vec_IntEntry(vCube,iVar10);
      iVar4 = Abc_LitIsCompl(Lit);
      uVar5 = Abc_Lit2Var(Lit);
      pVarValues[uVar5] = (iVar4 == 0) + 1;
    }
    pC = GetFreeCube();
    pdVar1 = pC->pCubeDataIn;
    if (*pdVar1 != 0) {
      for (lVar8 = 0; lVar8 < g_CoverInfo.nWordsIn; lVar8 = lVar8 + 1) {
        pdVar1[lVar8] = 0;
      }
      for (lVar8 = 0; lVar8 < g_CoverInfo.nWordsOut; lVar8 = lVar8 + 1) {
        pC->pCubeDataOut[lVar8] = 0;
      }
    }
    InsertVarsWithoutClearing(pC,pVars,g_CoverInfo.nVarsIn,pVarValues,~uVar3);
    pC->a = (short)vCube->nSize;
    pC->z = 1;
    iVar10 = ComputeQCost(vCube);
    pC->q = (short)iVar10;
    iVar10 = g_CoverInfo.cIDs + 1;
    bVar2 = (byte)g_CoverInfo.cIDs;
    g_CoverInfo.cIDs = iVar10;
    pC->ID = bVar2;
    if (iVar10 == 0x100) {
      g_CoverInfo.cIDs = 1;
    }
    CheckForCloseCubes(pC,1);
    g_CoverInfo.nLiteralsBefore = g_CoverInfo.nLiteralsBefore + vCube->nSize;
    iVar10 = ComputeQCost(vCube);
    g_CoverInfo.QCostBefore = g_CoverInfo.QCostBefore + iVar10;
    lVar9 = lVar9 + 1;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x3ba,"int Vec_IntPop(Vec_Int_t *)");
}

Assistant:

void AddCubesToStartingCover( Vec_Wec_t * vEsop )
{
    Vec_Int_t * vCube;
    Cube * pNew;
    int * s_Level2Var;
    int * s_LevelValues;
    int c, i, k, Lit, Out;

    s_Level2Var = ABC_ALLOC( int, g_CoverInfo.nVarsIn );
    s_LevelValues = ABC_ALLOC( int, g_CoverInfo.nVarsIn );

    for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
        s_Level2Var[i] = i;

    g_CoverInfo.nLiteralsBefore = 0;
    g_CoverInfo.QCostBefore = 0;
    Vec_WecForEachLevel( vEsop, vCube, c )
    {
        // get the output of this cube
        Out = -Vec_IntPop(vCube) - 1;

        // fill in the cube with blanks
        for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
            s_LevelValues[i] = VAR_ABS;
        Vec_IntForEachEntry( vCube, Lit, k )
        {
            if ( Abc_LitIsCompl(Lit) )
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_NEG;
            else
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_POS;
        }

        // get the new cube
        pNew = GetFreeCube();
        // consider the need to clear the cube
        if ( pNew->pCubeDataIn[0] ) // this is a recycled cube
        {
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                pNew->pCubeDataIn[i] = 0;
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                pNew->pCubeDataOut[i] = 0;
        }

        InsertVarsWithoutClearing( pNew, s_Level2Var, g_CoverInfo.nVarsIn, s_LevelValues, Out );
        // set literal counts
        pNew->a = Vec_IntSize(vCube);
        pNew->z = 1;
        pNew->q = ComputeQCost(vCube);
        // set the ID
        pNew->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // add this cube to storage
        CheckForCloseCubes( pNew, 1 );

        g_CoverInfo.nLiteralsBefore += Vec_IntSize(vCube);
        g_CoverInfo.QCostBefore += ComputeQCost(vCube);
    }
    ABC_FREE( s_Level2Var );
    ABC_FREE( s_LevelValues );

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );
}